

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3SchemaClear(void *p)

{
  HashElem *pHVar1;
  Hash temp2;
  Hash temp1;
  sqlite3 xdb;
  Hash local_368;
  Hash local_348;
  sqlite3 local_330;
  
  memset(&local_330,0,0x310);
  local_348._0_8_ = *(undefined8 *)((long)p + 8);
  local_348.first = *(HashElem **)((long)p + 0x10);
  local_348.ht = *(_ht **)((long)p + 0x18);
  local_368.ht = *(_ht **)((long)p + 0x48);
  local_368._0_8_ = *(undefined8 *)((long)p + 0x38);
  local_368.first = *(HashElem **)((long)p + 0x40);
  *(undefined8 *)((long)p + 0x38) = 0;
  *(undefined8 *)((long)p + 0x40) = 0;
  *(undefined8 *)((long)p + 0x48) = 0;
  sqlite3HashClear((Hash *)((long)p + 0x20));
  if (local_368.first != (HashElem *)0x0) {
    pHVar1 = local_368.first;
    do {
      sqlite3DeleteTrigger(&local_330,(Trigger *)pHVar1->data);
      pHVar1 = pHVar1->next;
    } while (pHVar1 != (HashElem *)0x0);
  }
  sqlite3HashClear(&local_368);
  *(undefined8 *)((long)p + 8) = 0;
  *(undefined8 *)((long)p + 0x10) = 0;
  *(undefined8 *)((long)p + 0x18) = 0;
  if (local_348.first != (HashElem *)0x0) {
    pHVar1 = local_348.first;
    do {
      sqlite3DeleteTable(&local_330,(Table *)pHVar1->data);
      pHVar1 = pHVar1->next;
    } while (pHVar1 != (HashElem *)0x0);
  }
  sqlite3HashClear(&local_348);
  sqlite3HashClear((Hash *)((long)p + 0x50));
  *(undefined8 *)((long)p + 0x68) = 0;
  if ((*(ushort *)((long)p + 0x72) & 1) != 0) {
    *(int *)((long)p + 4) = *(int *)((long)p + 4) + 1;
  }
  *(ushort *)((long)p + 0x72) = *(ushort *)((long)p + 0x72) & 0xfff6;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SchemaClear(void *p){
  Hash temp1;
  Hash temp2;
  HashElem *pElem;
  Schema *pSchema = (Schema *)p;
  sqlite3 xdb;

  memset(&xdb, 0, sizeof(xdb));
  temp1 = pSchema->tblHash;
  temp2 = pSchema->trigHash;
  sqlite3HashInit(&pSchema->trigHash);
  sqlite3HashClear(&pSchema->idxHash);
  for(pElem=sqliteHashFirst(&temp2); pElem; pElem=sqliteHashNext(pElem)){
    sqlite3DeleteTrigger(&xdb, (Trigger*)sqliteHashData(pElem));
  }
  sqlite3HashClear(&temp2);
  sqlite3HashInit(&pSchema->tblHash);
  for(pElem=sqliteHashFirst(&temp1); pElem; pElem=sqliteHashNext(pElem)){
    Table *pTab = sqliteHashData(pElem);
    sqlite3DeleteTable(&xdb, pTab);
  }
  sqlite3HashClear(&temp1);
  sqlite3HashClear(&pSchema->fkeyHash);
  pSchema->pSeqTab = 0;
  if( pSchema->schemaFlags & DB_SchemaLoaded ){
    pSchema->iGeneration++;
  }
  pSchema->schemaFlags &= ~(DB_SchemaLoaded|DB_ResetWanted);
}